

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cc
# Opt level: O0

bool __thiscall board::Board::sqAttacked(Board *this,int square,int side)

{
  int local_38;
  int local_34;
  int i_3;
  int i_2;
  int i_1;
  int i;
  int piece;
  int targetSquare;
  int side_local;
  int square_local;
  Board *this_local;
  
  if ((side == 0) && ((this->board[square + -0xb] == 1 || (this->board[square + -9] == 1)))) {
    this_local._7_1_ = true;
  }
  else if ((side == 1) && ((this->board[square + 0xb] == 7 || (this->board[square + 9] == 7)))) {
    this_local._7_1_ = true;
  }
  else {
    for (i_2 = 0; i_2 < 8; i_2 = i_2 + 1) {
      if ((side == 0) && (this->board[square + MOVE_DIR[2][i_2]] == 2)) {
        return true;
      }
      if ((side == 1) && (this->board[square + MOVE_DIR[2][i_2]] == 8)) {
        return true;
      }
    }
    for (i_3 = 0; i_3 < 4; i_3 = i_3 + 1) {
      i = square + MOVE_DIR[4][i_3];
      i_1 = this->board[i];
      while (i_1 != 99) {
        if (i_1 != 0) {
          if ((side == 0) && ((this->board[i] == 4 || (this->board[i] == 5)))) {
            return true;
          }
          if ((side == 1) && ((this->board[i] == 10 || (this->board[i] == 0xb)))) {
            return true;
          }
          break;
        }
        i = MOVE_DIR[4][i_3] + i;
        i_1 = this->board[i];
      }
    }
    for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
      i = square + MOVE_DIR[3][local_34];
      i_1 = this->board[i];
      while (i_1 != 99) {
        if (i_1 != 0) {
          if ((side == 0) && ((this->board[i] == 3 || (this->board[i] == 5)))) {
            return true;
          }
          if ((side == 1) && ((this->board[i] == 9 || (this->board[i] == 0xb)))) {
            return true;
          }
          break;
        }
        i = MOVE_DIR[3][local_34] + i;
        i_1 = this->board[i];
      }
    }
    for (local_38 = 0; local_38 < 8; local_38 = local_38 + 1) {
      if (((side == 0) && (this->board[square + MOVE_DIR[6][local_38]] == 6)) ||
         ((side == 1 && (this->board[square + MOVE_DIR[6][local_38]] == 0xc)))) {
        return true;
      }
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool board::Board::sqAttacked(const int square, const int side) const
{
    int targetSquare;
    int piece;
    if (side == WHITE && (board[square - 11] == WP || board[square - 9] == WP)) {
        return true;
    }
    if (side == BLACK && (board[square + 11] == BP || board[square + 9] == BP)) {
        return true;
    }
    for (int i = 0; i < 8; i++) {
        piece = board[square + MOVE_DIR[WN][i]];
        if (side == WHITE && piece == WN) {
            return true;
        }
        if (side == BLACK && piece == BN) {
            return true;
        }
    }
    for (int i = 0; i < 4; i++) {
        targetSquare = square + MOVE_DIR[WR][i];
        piece = board[targetSquare];
        while (piece != NO_SQ) {
            if (piece != EMPTY) {
                if (side == WHITE && (board[targetSquare] == WR || board[targetSquare] == WQ)) {
                    return true;
                }
                if (side == BLACK && (board[targetSquare] == BR || board[targetSquare] == BQ)) {
                    return true;
                }
                break;
            }
            targetSquare += MOVE_DIR[WR][i];
            piece = board[targetSquare];
        }
    }
    for (int i = 0; i < 4; i++) {
        targetSquare = square + MOVE_DIR[WB][i];
        piece = board[targetSquare];
        while (piece != NO_SQ) {
            if (piece != EMPTY) {
                if (side == WHITE && (board[targetSquare] == WB || board[targetSquare] == WQ)) {
                    return true;
                }
                if (side == BLACK && (board[targetSquare] == BB || board[targetSquare] == BQ)) {
                    return true;
                }
                break;
            }
            targetSquare += MOVE_DIR[WB][i];
            piece = board[targetSquare];
        }
    }
    for (int i = 0; i < 8; i++) {
        piece = board[square + MOVE_DIR[WK][i]];
        if ((side == WHITE && piece == WK) || (side == BLACK && piece == BK)) {
            return true;
        }
    }
    return false;
}